

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::EpsCopyInputStream::ParseEndsInSlopRegion<false>
          (EpsCopyInputStream *this,char *begin,int overrun,int depth)

{
  bool bVar1;
  undefined4 in_register_00000014;
  
  if ((int)(uint)begin < 0) {
    ParseEndsInSlopRegion<false>();
  }
  else if ((uint)begin < 0x11) {
    bVar1 = anon_unknown_0::ParsingEndsInBuffer
                      ((anon_unknown_0 *)
                       (this->patch_buffer_ + (((ulong)begin & 0xffffffff) - 0x28)),
                       (char *)&this->next_chunk_,(char *)CONCAT44(in_register_00000014,overrun),
                       depth);
    return bVar1;
  }
  ParseEndsInSlopRegion<false>();
}

Assistant:

bool EpsCopyInputStream::ParseEndsInSlopRegion(const char* begin, int overrun,
                                               int depth) {
  constexpr int kSlopBytes = EpsCopyInputStream::kSlopBytes;
  ABSL_DCHECK_GE(overrun, 0);
  ABSL_DCHECK_LE(overrun, kSlopBytes);
  auto ptr = begin + overrun;
  auto end = begin + kSlopBytes;
  return ParsingEndsInBuffer(ptr, end, depth);
}